

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,string *str_raw)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  reference pvVar6;
  undefined1 *puVar7;
  long lVar8;
  ulong in_RSI;
  quad_value_bit_vector *in_RDI;
  bool bVar9;
  int j;
  int k;
  string hex_to_binary;
  char hex_digit;
  int i_1;
  int bit_ind;
  int i;
  int num_bits;
  string digits;
  char format;
  int ind;
  string bv_size;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  string *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *in_stack_fffffffffffffee0;
  int local_b8;
  int local_b4;
  string local_b0 [39];
  undefined1 local_89;
  int local_88;
  uchar local_7d;
  int local_7c;
  allocator local_71;
  string local_70 [39];
  char local_49;
  int local_48;
  allocator local_31;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::vector
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)0x19e901);
  in_RDI->N = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_48 = 0;
  while (pcVar4 = (char *)std::__cxx11::string::operator[](local_10), *pcVar4 != '\'') {
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    iVar1 = isdigit((int)*pcVar4);
    if (iVar1 == 0) {
      __assert_fail("isdigit(str_raw[ind])",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x12d,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)"
                   );
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    std::__cxx11::string::operator+=(local_30,*pcVar4);
    local_48 = local_48 + 1;
  }
  pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
  if (*pcVar4 != '\'') {
    __assert_fail("str_raw[ind] == \'\\\'\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x132,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  local_48 = local_48 + 1;
  pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
  local_49 = *pcVar4;
  bVar9 = true;
  if ((local_49 != 'b') && (bVar9 = true, local_49 != 'h')) {
    bVar9 = local_49 == 'd';
  }
  if (bVar9) {
    local_48 = local_48 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    for (; iVar1 = local_48, iVar2 = std::__cxx11::string::size(), iVar1 < iVar2;
        local_48 = local_48 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      std::__cxx11::string::operator+=(local_70,*pcVar4);
    }
    iVar1 = std::__cxx11::stoi(in_stack_fffffffffffffec0,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
    in_RDI->N = iVar1;
    std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
              (in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    for (local_7c = 0;
        sVar5 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::size
                          (&in_RDI->bits), local_7c < (int)sVar5; local_7c = local_7c + 1) {
      quad_value::quad_value
                ((quad_value *)in_stack_fffffffffffffec0,
                 (uchar)((uint)in_stack_fffffffffffffebc >> 0x18));
      pvVar6 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                         (&in_RDI->bits,(long)local_7c);
      pvVar6->value = local_7d;
    }
    if (local_49 != 'h') {
      __assert_fail("format == \'h\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x14e,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)"
                   );
    }
    iVar1 = 0;
    local_88 = std::__cxx11::string::size();
    while( true ) {
      local_88 = local_88 + -1;
      if (local_88 < 0) {
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_30);
        return;
      }
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_70);
      local_89 = *puVar7;
      hex_digit_to_binary_abi_cxx11_((char)((uint)iVar1 >> 0x18));
      lVar8 = std::__cxx11::string::size();
      if (lVar8 != 4) break;
      local_b4 = 0;
      local_b8 = std::__cxx11::string::size();
      while (local_b8 = local_b8 + -1, -1 < local_b8) {
        iVar2 = iVar1 + local_b4;
        iVar3 = bitLength(in_RDI);
        if (iVar2 < iVar3) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_b0);
          if (*pcVar4 == '1') {
            quad_value::quad_value
                      ((quad_value *)in_stack_fffffffffffffec0,
                       (uchar)((uint)in_stack_fffffffffffffebc >> 0x18));
            set((quad_value_bit_vector *)
                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0,
                (quad_value)(uchar)((ulong)in_stack_fffffffffffffec0 >> 0x38));
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_b0);
            if (*pcVar4 == '0') {
              quad_value::quad_value
                        ((quad_value *)in_stack_fffffffffffffec0,
                         (uchar)((uint)in_stack_fffffffffffffebc >> 0x18));
              set((quad_value_bit_vector *)
                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0,
                  (quad_value)(uchar)((ulong)in_stack_fffffffffffffec0 >> 0x38));
            }
            else {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_b0);
              if (*pcVar4 == 'x') {
                quad_value::quad_value
                          ((quad_value *)in_stack_fffffffffffffec0,
                           (uchar)((uint)in_stack_fffffffffffffebc >> 0x18));
                set((quad_value_bit_vector *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0,
                    (quad_value)(uchar)((ulong)in_stack_fffffffffffffec0 >> 0x38));
              }
              else {
                in_stack_fffffffffffffec0 =
                     (string *)std::__cxx11::string::operator[]((ulong)local_b0);
                if (*(uchar *)in_stack_fffffffffffffec0 != 'z') {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                ,0x165,
                                "bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)"
                               );
                }
                in_stack_fffffffffffffebc = iVar1 + local_b4;
                quad_value::quad_value
                          ((quad_value *)in_stack_fffffffffffffec0,
                           (uchar)((uint)in_stack_fffffffffffffebc >> 0x18));
                set((quad_value_bit_vector *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0,
                    (quad_value)(uchar)((ulong)in_stack_fffffffffffffec0 >> 0x38));
              }
            }
          }
          local_b4 = local_b4 + 1;
        }
      }
      iVar1 = iVar1 + 4;
      std::__cxx11::string::~string(local_b0);
    }
    __assert_fail("hex_to_binary.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x155,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  __assert_fail("(format == \'b\') || (format == \'h\') || (format == \'d\')",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0x13a,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
}

Assistant:

quad_value_bit_vector(const std::string& str_raw) : N(0) {
      std::string bv_size = "";
      int ind = 0;
      while (str_raw[ind] != '\'') {
        assert(isdigit(str_raw[ind]));
        bv_size += str_raw[ind];
        ind++;
      }

      assert (str_raw[ind] == '\'');

      ind++;

      char format = str_raw[ind];

      assert((format == 'b') ||
             (format == 'h') ||
             (format == 'd'));

      ind++;

      std::string digits = "";
      while (ind < ((int) str_raw.size())) {
        digits += str_raw[ind];
        ind++;
      }

      int num_bits = stoi(bv_size);
      N = num_bits;
      //bits.resize(NUM_BYTES(num_bits));
      bits.resize(num_bits);
      for (int i = 0; i < ((int) bits.size()); i++) {
        bits[i] = 0;
      }

      // TODO: Check that digits are not too long

      assert(format == 'h');

      int bit_ind = 0;
      for (int i = digits.size() - 1; i >= 0; i--) {
        char hex_digit = digits[i];
        std::string hex_to_binary = hex_digit_to_binary(hex_digit);

        assert(hex_to_binary.size() == 4);

        int k = 0;
        for (int j = hex_to_binary.size() - 1; j >= 0; j--) {
          // Dont add past the end
          if ((bit_ind + k) < bitLength()) {
            //std::cout << "setting digit = " << hex_to_binary[j] << std::endl;
            if (hex_to_binary[j] == '1') {
              set(bit_ind + k, quad_value(1));
            } else if (hex_to_binary[j] == '0') {
              set(bit_ind + k, quad_value(0));
            } else if (hex_to_binary[j] == 'x') {
              set(bit_ind + k, quad_value(QBV_UNKNOWN_VALUE));
            } else if (hex_to_binary[j] == 'z') {
              set(bit_ind + k, quad_value(QBV_HIGH_IMPEDANCE_VALUE));
            } else {
              assert(false);
            }
            k++;
          } else {
            //assert(hex_to_binary[j] == '0');
          }
        }
        bit_ind += 4;
      }

    }